

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV2
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  string *psVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  ostream *poVar5;
  char *pcVar6;
  reference pvVar7;
  ulong *in_RDX;
  long *in_RDI;
  size_t i_2;
  char **str_array;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  char *Name_1;
  DataType Type_1;
  bool Array_1;
  StringArrayAttr *ThisAttr_1;
  size_t i_1;
  char *Name;
  DataType Type;
  bool Array;
  PrimitiveTypeAttr *ThisAttr;
  size_t i;
  anon_class_1_0_00000001 lf_BreakdownTypeArray;
  BP5AttrStruct *Attrs;
  allocator *in_stack_ffffffffffffe9a0;
  char *in_stack_ffffffffffffe9a8;
  allocator *in_stack_ffffffffffffe9b0;
  long in_stack_ffffffffffffea38;
  allocator *in_stack_ffffffffffffedd8;
  string *in_stack_ffffffffffffede0;
  string *in_stack_ffffffffffffede8;
  string *in_stack_ffffffffffffedf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedf8;
  string *in_stack_ffffffffffffee00;
  IO *in_stack_ffffffffffffee08;
  allocator local_f19;
  string local_f18 [39];
  allocator local_ef1;
  string local_ef0 [39];
  allocator local_ec9;
  string local_ec8 [39];
  allocator local_ea1;
  string local_ea0 [39];
  allocator local_e79;
  string local_e78 [39];
  allocator local_e51;
  string local_e50 [39];
  allocator local_e29;
  string local_e28 [32];
  ulong local_e08;
  long local_e00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_df8;
  char *local_de0;
  DataType local_dd8;
  bool local_dd1;
  long *local_dd0;
  ulong local_dc8;
  string local_dc0 [39];
  allocator local_d99;
  string local_d98 [39];
  allocator local_d71;
  string local_d70 [39];
  allocator local_d49;
  string local_d48 [39];
  allocator local_d21;
  string local_d20 [39];
  allocator local_cf9;
  string local_cf8 [39];
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [39];
  allocator local_c81;
  string local_c80 [39];
  allocator local_c59;
  string local_c58 [39];
  allocator local_c31;
  string local_c30 [39];
  allocator local_c09;
  string local_c08 [39];
  allocator local_be1;
  string local_be0 [39];
  allocator local_bb9;
  string local_bb8 [39];
  allocator local_b91;
  string local_b90 [39];
  allocator local_b69;
  string local_b68 [39];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [39];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [39];
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78 [39];
  allocator local_a51;
  string local_a50 [39];
  allocator local_a29;
  string local_a28 [39];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [39];
  allocator local_9b1;
  string local_9b0 [39];
  allocator local_989;
  string local_988 [39];
  allocator local_961;
  string local_960 [39];
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [39];
  allocator local_899;
  string local_898 [39];
  allocator local_871;
  string local_870 [39];
  allocator local_849;
  string local_848 [39];
  allocator local_821;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [39];
  allocator local_7a9;
  string local_7a8 [39];
  allocator local_781;
  string local_780 [39];
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [32];
  string local_710 [39];
  allocator local_6e9;
  string local_6e8 [39];
  allocator local_6c1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [39];
  undefined1 local_5d1 [40];
  undefined1 local_5a9 [40];
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  string *local_50;
  DataType local_48;
  bool local_41;
  long *local_40;
  ulong local_38;
  anon_class_1_0_00000001 local_29;
  ulong *local_28;
  
  local_38 = 0;
  local_28 = in_RDX;
  do {
    if (*local_28 <= local_38) {
      for (local_dc8 = 0; local_dc8 < local_28[2]; local_dc8 = local_dc8 + 1) {
        local_dd0 = (long *)(local_28[3] + local_dc8 * 0x18);
        InstallAttributesV2::anon_class_1_0_00000001::operator()
                  (&local_29,(char *)*local_dd0,&local_dd8,&local_dd1);
        pcVar6 = (char *)(*local_dd0 + 1);
        local_de0 = pcVar6;
        if ((local_dd1 & 1U) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_ea0,pcVar6,&local_ea1);
          in_stack_ffffffffffffe9a8 = *(char **)local_dd0[2];
          in_stack_ffffffffffffe9b0 = &local_ec9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_ec8,in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9b0);
          in_stack_ffffffffffffe9a0 = &local_ef1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_ef0,"",in_stack_ffffffffffffe9a0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f18,"/",&local_f19);
          core::IO::DefineAttribute<std::__cxx11::string>
                    (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,
                     in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                     SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
          std::__cxx11::string::~string(local_f18);
          std::allocator<char>::~allocator((allocator<char> *)&local_f19);
          std::__cxx11::string::~string(local_ef0);
          std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
          std::__cxx11::string::~string(local_ec8);
          std::allocator<char>::~allocator((allocator<char> *)&local_ec9);
          std::__cxx11::string::~string(local_ea0);
          std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0xcf79bf);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffe9b0,(size_type)in_stack_ffffffffffffe9a8);
          local_e00 = local_dd0[2];
          for (local_e08 = 0; pcVar6 = local_de0, local_e08 < (ulong)local_dd0[1];
              local_e08 = local_e08 + 1) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_df8,local_e08);
            std::__cxx11::string::assign((char *)pvVar7);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e28,pcVar6,&local_e29);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::data((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0xcf7ad9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_df8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e50,"",&local_e51);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e78,"/",&local_e79);
          core::IO::DefineAttribute<std::__cxx11::string>
                    (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,
                     (size_t)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                     in_stack_ffffffffffffede0,SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
          std::__cxx11::string::~string(local_e78);
          std::allocator<char>::~allocator((allocator<char> *)&local_e79);
          std::__cxx11::string::~string(local_e50);
          std::allocator<char>::~allocator((allocator<char> *)&local_e51);
          std::__cxx11::string::~string(local_e28);
          std::allocator<char>::~allocator((allocator<char> *)&local_e29);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe9a0);
        }
      }
      return;
    }
    local_40 = (long *)(local_28[1] + local_38 * 0x18);
    InstallAttributesV2::anon_class_1_0_00000001::operator()
              (&local_29,(char *)*local_40,&local_48,&local_41);
    DVar4 = local_48;
    local_50 = (string *)(*local_40 + 1);
    if ((local_41 & 1U) == 0) {
      if (local_48 == Struct) {
        return;
      }
      DVar3 = helper::GetDataType<char>();
      DVar2 = local_48;
      psVar1 = local_50;
      if (DVar4 == DVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_730,(char *)psVar1,&local_731);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_758,"",&local_759);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_780,"/",&local_781);
        core::IO::DefineAttribute<char>
                  (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                   (char *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                   in_stack_ffffffffffffede8,SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
        std::__cxx11::string::~string(local_780);
        std::allocator<char>::~allocator((allocator<char> *)&local_781);
        std::__cxx11::string::~string(local_758);
        std::allocator<char>::~allocator((allocator<char> *)&local_759);
        std::__cxx11::string::~string(local_730);
        std::allocator<char>::~allocator((allocator<char> *)&local_731);
      }
      else {
        DVar3 = helper::GetDataType<signed_char>();
        DVar4 = local_48;
        psVar1 = local_50;
        if (DVar2 == DVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7a8,(char *)psVar1,&local_7a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7d0,"",&local_7d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7f8,"/",&local_7f9);
          core::IO::DefineAttribute<signed_char>
                    (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                     (char *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                     in_stack_ffffffffffffede8,SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
          std::__cxx11::string::~string(local_7f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
          std::__cxx11::string::~string(local_7d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
          std::__cxx11::string::~string(local_7a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
        }
        else {
          DVar3 = helper::GetDataType<short>();
          DVar2 = local_48;
          psVar1 = local_50;
          if (DVar4 == DVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_820,(char *)psVar1,&local_821);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_848,"",&local_849);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_870,"/",&local_871);
            core::IO::DefineAttribute<short>
                      (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                       (short *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                       in_stack_ffffffffffffede8,SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
            std::__cxx11::string::~string(local_870);
            std::allocator<char>::~allocator((allocator<char> *)&local_871);
            std::__cxx11::string::~string(local_848);
            std::allocator<char>::~allocator((allocator<char> *)&local_849);
            std::__cxx11::string::~string(local_820);
            std::allocator<char>::~allocator((allocator<char> *)&local_821);
          }
          else {
            DVar3 = helper::GetDataType<int>();
            DVar4 = local_48;
            psVar1 = local_50;
            if (DVar2 == DVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_898,(char *)psVar1,&local_899);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_8c0,"",&local_8c1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_8e8,"/",&local_8e9);
              core::IO::DefineAttribute<int>
                        (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                         (int *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                         in_stack_ffffffffffffede8,SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0)
                        );
              std::__cxx11::string::~string(local_8e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
              std::__cxx11::string::~string(local_8c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
              std::__cxx11::string::~string(local_898);
              std::allocator<char>::~allocator((allocator<char> *)&local_899);
            }
            else {
              DVar3 = helper::GetDataType<long>();
              DVar2 = local_48;
              psVar1 = local_50;
              if (DVar4 == DVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_910,(char *)psVar1,&local_911);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_938,"",&local_939);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_960,"/",&local_961);
                core::IO::DefineAttribute<long>
                          (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                           (long *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                           in_stack_ffffffffffffede8,
                           SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                std::__cxx11::string::~string(local_960);
                std::allocator<char>::~allocator((allocator<char> *)&local_961);
                std::__cxx11::string::~string(local_938);
                std::allocator<char>::~allocator((allocator<char> *)&local_939);
                std::__cxx11::string::~string(local_910);
                std::allocator<char>::~allocator((allocator<char> *)&local_911);
              }
              else {
                DVar3 = helper::GetDataType<unsigned_char>();
                DVar4 = local_48;
                psVar1 = local_50;
                if (DVar2 == DVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_988,(char *)psVar1,&local_989);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_9b0,"",&local_9b1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_9d8,"/",&local_9d9);
                  core::IO::DefineAttribute<unsigned_char>
                            (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                             (uchar *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                             in_stack_ffffffffffffede8,
                             SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                  std::__cxx11::string::~string(local_9d8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
                  std::__cxx11::string::~string(local_9b0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
                  std::__cxx11::string::~string(local_988);
                  std::allocator<char>::~allocator((allocator<char> *)&local_989);
                }
                else {
                  DVar3 = helper::GetDataType<unsigned_short>();
                  DVar2 = local_48;
                  psVar1 = local_50;
                  if (DVar4 == DVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_a00,(char *)psVar1,&local_a01);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_a28,"",&local_a29);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_a50,"/",&local_a51);
                    core::IO::DefineAttribute<unsigned_short>
                              (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                               (unsigned_short *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0
                               ,in_stack_ffffffffffffede8,
                               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                    std::__cxx11::string::~string(local_a50);
                    std::allocator<char>::~allocator((allocator<char> *)&local_a51);
                    std::__cxx11::string::~string(local_a28);
                    std::allocator<char>::~allocator((allocator<char> *)&local_a29);
                    std::__cxx11::string::~string(local_a00);
                    std::allocator<char>::~allocator((allocator<char> *)&local_a01);
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_int>();
                    DVar4 = local_48;
                    psVar1 = local_50;
                    if (DVar2 == DVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_a78,(char *)psVar1,&local_a79);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_aa0,"",&local_aa1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_ac8,"/",&local_ac9);
                      core::IO::DefineAttribute<unsigned_int>
                                (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                 (uint *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                                 in_stack_ffffffffffffede8,
                                 SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                      std::__cxx11::string::~string(local_ac8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
                      std::__cxx11::string::~string(local_aa0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
                      std::__cxx11::string::~string(local_a78);
                      std::allocator<char>::~allocator((allocator<char> *)&local_a79);
                    }
                    else {
                      DVar3 = helper::GetDataType<unsigned_long>();
                      DVar2 = local_48;
                      psVar1 = local_50;
                      if (DVar4 == DVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_af0,(char *)psVar1,&local_af1);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_b18,"",&local_b19);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_b40,"/",&local_b41);
                        core::IO::DefineAttribute<unsigned_long>
                                  (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                   (unsigned_long *)in_stack_ffffffffffffedf8,
                                   in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                                   SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                        std::__cxx11::string::~string(local_b40);
                        std::allocator<char>::~allocator((allocator<char> *)&local_b41);
                        std::__cxx11::string::~string(local_b18);
                        std::allocator<char>::~allocator((allocator<char> *)&local_b19);
                        std::__cxx11::string::~string(local_af0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_af1);
                      }
                      else {
                        DVar3 = helper::GetDataType<float>();
                        DVar4 = local_48;
                        psVar1 = local_50;
                        if (DVar2 == DVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_b68,(char *)psVar1,&local_b69);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_b90,"",&local_b91);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_bb8,"/",&local_bb9);
                          core::IO::DefineAttribute<float>
                                    (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                     (float *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                                     in_stack_ffffffffffffede8,
                                     SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                          std::__cxx11::string::~string(local_bb8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
                          std::__cxx11::string::~string(local_b90);
                          std::allocator<char>::~allocator((allocator<char> *)&local_b91);
                          std::__cxx11::string::~string(local_b68);
                          std::allocator<char>::~allocator((allocator<char> *)&local_b69);
                        }
                        else {
                          DVar3 = helper::GetDataType<double>();
                          DVar2 = local_48;
                          psVar1 = local_50;
                          if (DVar4 == DVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_be0,(char *)psVar1,&local_be1);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_c08,"",&local_c09);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_c30,"/",&local_c31);
                            core::IO::DefineAttribute<double>
                                      (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                       (double *)in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0
                                       ,in_stack_ffffffffffffede8,
                                       SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                            std::__cxx11::string::~string(local_c30);
                            std::allocator<char>::~allocator((allocator<char> *)&local_c31);
                            std::__cxx11::string::~string(local_c08);
                            std::allocator<char>::~allocator((allocator<char> *)&local_c09);
                            std::__cxx11::string::~string(local_be0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_be1);
                          }
                          else {
                            DVar3 = helper::GetDataType<long_double>();
                            DVar4 = local_48;
                            psVar1 = local_50;
                            if (DVar2 == DVar3) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_c58,(char *)psVar1,&local_c59);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_c80,"",&local_c81);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_ca8,"/",&local_ca9);
                              core::IO::DefineAttribute<long_double>
                                        (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                         (longdouble *)in_stack_ffffffffffffedf8,
                                         in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                                         SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                              std::__cxx11::string::~string(local_ca8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
                              std::__cxx11::string::~string(local_c80);
                              std::allocator<char>::~allocator((allocator<char> *)&local_c81);
                              std::__cxx11::string::~string(local_c58);
                              std::allocator<char>::~allocator((allocator<char> *)&local_c59);
                            }
                            else {
                              DVar3 = helper::GetDataType<std::complex<float>>();
                              DVar2 = local_48;
                              psVar1 = local_50;
                              if (DVar4 == DVar3) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_cd0,(char *)psVar1,&local_cd1);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_cf8,"",&local_cf9);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_d20,"/",&local_d21);
                                core::IO::DefineAttribute<std::complex<float>>
                                          (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                           (complex<float> *)in_stack_ffffffffffffedf8,
                                           in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                                           SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                                std::__cxx11::string::~string(local_d20);
                                std::allocator<char>::~allocator((allocator<char> *)&local_d21);
                                std::__cxx11::string::~string(local_cf8);
                                std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
                                std::__cxx11::string::~string(local_cd0);
                                std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
                              }
                              else {
                                DVar4 = helper::GetDataType<std::complex<double>>();
                                psVar1 = local_50;
                                if (DVar2 == DVar4) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_d48,(char *)psVar1,&local_d49);
                                  in_stack_ffffffffffffea38 = local_40[2];
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_d70,"",&local_d71);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_d98,"/",&local_d99);
                                  core::IO::DefineAttribute<std::complex<double>>
                                            (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                             (complex<double> *)in_stack_ffffffffffffedf8,
                                             in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                                             SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0));
                                  std::__cxx11::string::~string(local_d98);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_d99);
                                  std::__cxx11::string::~string(local_d70);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
                                  std::__cxx11::string::~string(local_d48);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_d49);
                                }
                                else {
                                  poVar5 = std::operator<<((ostream *)&std::cout,
                                                           "Loading attribute matched no type ");
                                  ToString_abi_cxx11_((DataType)
                                                      ((ulong)in_stack_ffffffffffffea38 >> 0x20));
                                  poVar5 = std::operator<<(poVar5,local_dc0);
                                  std::ostream::operator<<
                                            (poVar5,std::endl<char,std::char_traits<char>>);
                                  std::__cxx11::string::~string(local_dc0);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      if (local_48 == Struct) {
        return;
      }
      DVar3 = helper::GetDataType<char>();
      DVar2 = local_48;
      psVar1 = local_50;
      if (DVar4 == DVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,(char *)psVar1,&local_71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"",&local_a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"/",&local_d1);
        core::IO::DefineAttribute<char>
                  (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                   (char *)in_stack_ffffffffffffedf8,(size_t)in_stack_ffffffffffffedf0,
                   in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                   SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
      else {
        DVar3 = helper::GetDataType<signed_char>();
        DVar4 = local_48;
        psVar1 = local_50;
        if (DVar2 == DVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f8,(char *)psVar1,&local_f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_120,"",&local_121);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_148,"/",&local_149);
          core::IO::DefineAttribute<signed_char>
                    (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                     (char *)in_stack_ffffffffffffedf8,(size_t)in_stack_ffffffffffffedf0,
                     in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                     SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          std::__cxx11::string::~string(local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        }
        else {
          DVar3 = helper::GetDataType<short>();
          DVar2 = local_48;
          psVar1 = local_50;
          if (DVar4 == DVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_170,(char *)psVar1,&local_171);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_198,"",&local_199);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1c0,"/",&local_1c1);
            core::IO::DefineAttribute<short>
                      (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                       (short *)in_stack_ffffffffffffedf8,(size_t)in_stack_ffffffffffffedf0,
                       in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                       SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
            std::__cxx11::string::~string(local_1c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
            std::__cxx11::string::~string(local_198);
            std::allocator<char>::~allocator((allocator<char> *)&local_199);
            std::__cxx11::string::~string(local_170);
            std::allocator<char>::~allocator((allocator<char> *)&local_171);
          }
          else {
            DVar3 = helper::GetDataType<int>();
            DVar4 = local_48;
            psVar1 = local_50;
            if (DVar2 == DVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1e8,(char *)psVar1,&local_1e9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_210,"",&local_211);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_238,"/",&local_239);
              core::IO::DefineAttribute<int>
                        (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                         (int *)in_stack_ffffffffffffedf8,(size_t)in_stack_ffffffffffffedf0,
                         in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                         SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
              std::__cxx11::string::~string(local_238);
              std::allocator<char>::~allocator((allocator<char> *)&local_239);
              std::__cxx11::string::~string(local_210);
              std::allocator<char>::~allocator((allocator<char> *)&local_211);
              std::__cxx11::string::~string(local_1e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            }
            else {
              DVar3 = helper::GetDataType<long>();
              DVar2 = local_48;
              psVar1 = local_50;
              if (DVar4 == DVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_260,(char *)psVar1,&local_261);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_288,"",&local_289);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2b0,"/",&local_2b1);
                core::IO::DefineAttribute<long>
                          (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                           (long *)in_stack_ffffffffffffedf8,(size_t)in_stack_ffffffffffffedf0,
                           in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                           SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                std::__cxx11::string::~string(local_2b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                std::__cxx11::string::~string(local_288);
                std::allocator<char>::~allocator((allocator<char> *)&local_289);
                std::__cxx11::string::~string(local_260);
                std::allocator<char>::~allocator((allocator<char> *)&local_261);
              }
              else {
                DVar3 = helper::GetDataType<unsigned_char>();
                DVar4 = local_48;
                psVar1 = local_50;
                if (DVar2 == DVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_2d8,(char *)psVar1,&local_2d9);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_300,"",&local_301);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_328,"/",&local_329);
                  core::IO::DefineAttribute<unsigned_char>
                            (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                             (uchar *)in_stack_ffffffffffffedf8,(size_t)in_stack_ffffffffffffedf0,
                             in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                             SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                  std::__cxx11::string::~string(local_328);
                  std::allocator<char>::~allocator((allocator<char> *)&local_329);
                  std::__cxx11::string::~string(local_300);
                  std::allocator<char>::~allocator((allocator<char> *)&local_301);
                  std::__cxx11::string::~string(local_2d8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
                }
                else {
                  DVar3 = helper::GetDataType<unsigned_short>();
                  DVar2 = local_48;
                  psVar1 = local_50;
                  if (DVar4 == DVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_350,(char *)psVar1,&local_351);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_378,"",&local_379);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_3a0,"/",&local_3a1);
                    core::IO::DefineAttribute<unsigned_short>
                              (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                               (unsigned_short *)in_stack_ffffffffffffedf8,
                               (size_t)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                               in_stack_ffffffffffffede0,
                               SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                    std::__cxx11::string::~string(local_3a0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
                    std::__cxx11::string::~string(local_378);
                    std::allocator<char>::~allocator((allocator<char> *)&local_379);
                    std::__cxx11::string::~string(local_350);
                    std::allocator<char>::~allocator((allocator<char> *)&local_351);
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_int>();
                    DVar4 = local_48;
                    psVar1 = local_50;
                    if (DVar2 == DVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_3c8,(char *)psVar1,&local_3c9);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_3f0,"",&local_3f1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_418,"/",&local_419);
                      core::IO::DefineAttribute<unsigned_int>
                                (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                 (uint *)in_stack_ffffffffffffedf8,(size_t)in_stack_ffffffffffffedf0
                                 ,in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                                 SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                      std::__cxx11::string::~string(local_418);
                      std::allocator<char>::~allocator((allocator<char> *)&local_419);
                      std::__cxx11::string::~string(local_3f0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
                      std::__cxx11::string::~string(local_3c8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
                    }
                    else {
                      DVar3 = helper::GetDataType<unsigned_long>();
                      DVar2 = local_48;
                      psVar1 = local_50;
                      if (DVar4 == DVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_440,(char *)psVar1,&local_441);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_468,"",&local_469);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_490,"/",&local_491);
                        core::IO::DefineAttribute<unsigned_long>
                                  (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                   (unsigned_long *)in_stack_ffffffffffffedf8,
                                   (size_t)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                                   in_stack_ffffffffffffede0,
                                   SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                        std::__cxx11::string::~string(local_490);
                        std::allocator<char>::~allocator((allocator<char> *)&local_491);
                        std::__cxx11::string::~string(local_468);
                        std::allocator<char>::~allocator((allocator<char> *)&local_469);
                        std::__cxx11::string::~string(local_440);
                        std::allocator<char>::~allocator((allocator<char> *)&local_441);
                      }
                      else {
                        DVar3 = helper::GetDataType<float>();
                        DVar4 = local_48;
                        psVar1 = local_50;
                        if (DVar2 == DVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_4b8,(char *)psVar1,&local_4b9);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_4e0,"",&local_4e1);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_508,"/",&local_509);
                          core::IO::DefineAttribute<float>
                                    (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                     (float *)in_stack_ffffffffffffedf8,
                                     (size_t)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                                     in_stack_ffffffffffffede0,
                                     SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                          std::__cxx11::string::~string(local_508);
                          std::allocator<char>::~allocator((allocator<char> *)&local_509);
                          std::__cxx11::string::~string(local_4e0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
                          std::__cxx11::string::~string(local_4b8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
                        }
                        else {
                          DVar3 = helper::GetDataType<double>();
                          DVar2 = local_48;
                          psVar1 = local_50;
                          if (DVar4 == DVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_530,(char *)psVar1,&local_531);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_558,"",&local_559);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_580,"/",&local_581);
                            core::IO::DefineAttribute<double>
                                      (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                       (double *)in_stack_ffffffffffffedf8,
                                       (size_t)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                                       in_stack_ffffffffffffede0,
                                       SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                            std::__cxx11::string::~string(local_580);
                            std::allocator<char>::~allocator((allocator<char> *)&local_581);
                            std::__cxx11::string::~string(local_558);
                            std::allocator<char>::~allocator((allocator<char> *)&local_559);
                            std::__cxx11::string::~string(local_530);
                            std::allocator<char>::~allocator((allocator<char> *)&local_531);
                          }
                          else {
                            DVar3 = helper::GetDataType<long_double>();
                            DVar4 = local_48;
                            if (DVar2 == DVar3) {
                              in_stack_ffffffffffffedf8 =
                                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     **)(in_RDI[2] + 0x28);
                              in_stack_ffffffffffffee08 = (IO *)local_5a9;
                              in_stack_ffffffffffffee00 = local_50;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)(local_5a9 + 1),(char *)in_stack_ffffffffffffee00
                                         ,(allocator *)in_stack_ffffffffffffee08);
                              in_stack_ffffffffffffede0 = (string *)local_40[2];
                              in_stack_ffffffffffffede8 =
                                   (string *)
                                   ((ulong)local_40[1] /
                                   *(ulong *)((long)in_RDI +
                                             (long)(int)local_48 * 8 + *(long *)(*in_RDI + -0x18)));
                              in_stack_ffffffffffffedf0 = (string *)local_5d1;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)(local_5d1 + 1),"",
                                         (allocator *)in_stack_ffffffffffffedf0);
                              in_stack_ffffffffffffedd8 = &local_5f9;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_5f8,"/",in_stack_ffffffffffffedd8);
                              core::IO::DefineAttribute<long_double>
                                        (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                         (longdouble *)in_stack_ffffffffffffedf8,
                                         (size_t)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8
                                         ,in_stack_ffffffffffffede0,
                                         SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                              std::__cxx11::string::~string(local_5f8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
                              std::__cxx11::string::~string((string *)(local_5d1 + 1));
                              std::allocator<char>::~allocator((allocator<char> *)local_5d1);
                              std::__cxx11::string::~string((string *)(local_5a9 + 1));
                              std::allocator<char>::~allocator((allocator<char> *)local_5a9);
                            }
                            else {
                              DVar3 = helper::GetDataType<std::complex<float>>();
                              DVar2 = local_48;
                              psVar1 = local_50;
                              if (DVar4 == DVar3) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_620,(char *)psVar1,&local_621);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_648,"",&local_649);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_670,"/",&local_671);
                                core::IO::DefineAttribute<std::complex<float>>
                                          (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                           (complex<float> *)in_stack_ffffffffffffedf8,
                                           (size_t)in_stack_ffffffffffffedf0,
                                           in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                                           SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                                std::__cxx11::string::~string(local_670);
                                std::allocator<char>::~allocator((allocator<char> *)&local_671);
                                std::__cxx11::string::~string(local_648);
                                std::allocator<char>::~allocator((allocator<char> *)&local_649);
                                std::__cxx11::string::~string(local_620);
                                std::allocator<char>::~allocator((allocator<char> *)&local_621);
                              }
                              else {
                                DVar4 = helper::GetDataType<std::complex<double>>();
                                psVar1 = local_50;
                                if (DVar2 == DVar4) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_698,(char *)psVar1,&local_699);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_6c0,"",&local_6c1);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_6e8,"/",&local_6e9);
                                  core::IO::DefineAttribute<std::complex<double>>
                                            (in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                                             (complex<double> *)in_stack_ffffffffffffedf8,
                                             (size_t)in_stack_ffffffffffffedf0,
                                             in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
                                             SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
                                  std::__cxx11::string::~string(local_6e8);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
                                  std::__cxx11::string::~string(local_6c0);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
                                  std::__cxx11::string::~string(local_698);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_699);
                                }
                                else {
                                  poVar5 = std::operator<<((ostream *)&std::cout,
                                                           "Loading attribute matched no type ");
                                  ToString_abi_cxx11_((DataType)
                                                      ((ulong)in_stack_ffffffffffffea38 >> 0x20));
                                  poVar5 = std::operator<<(poVar5,local_710);
                                  std::ostream::operator<<
                                            (poVar5,std::endl<char,std::char_traits<char>>);
                                  std::__cxx11::string::~string(local_710);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void BP5Deserializer::InstallAttributesV2(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    BP5AttrStruct *Attrs = (BP5AttrStruct *)BaseData;

    auto lf_BreakdownTypeArray = [](const char *Name, DataType &Type, bool &Array) {
        Type = (DataType)(Name[0] - '0');
        Array = false;
        if ((int)Type > 18)
        {
            Type = (DataType)((int)Type - 18);
            Array = true;
        }
    };

    for (size_t i = 0; i < Attrs->PrimAttrCount; i++)
    {
        PrimitiveTypeAttr *ThisAttr = &Attrs->PrimAttrs[i];
        bool Array;
        DataType Type;
        lf_BreakdownTypeArray(ThisAttr->Name, Type, Array);
        const char *Name = &ThisAttr->Name[1];
        if (Array)
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, (T *)ThisAttr->Values,                             \
                                          ThisAttr->TotalElementSize / DataTypeSize[(int)Type],    \
                                          "", "/", true);                                          \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
        else
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, *(T *)ThisAttr->Values, "", "/", true);            \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
    }